

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# izmax1.c
# Opt level: O2

int izmax1_slu(int *n,doublecomplex *cx,int *incx)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  doublecomplex *pdVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  
  uVar1 = *n;
  if ((int)uVar1 < 1) {
    iVar3 = 0;
  }
  else {
    if (uVar1 == 1) {
      return 1;
    }
    iVar2 = *incx;
    dVar8 = ABS(cx->r);
    if ((long)iVar2 == 1) {
      pdVar6 = cx + 1;
      uVar4 = 1;
      for (uVar5 = 2; iVar3 = (int)uVar4, (ulong)uVar1 + 1 != uVar5; uVar5 = uVar5 + 1) {
        dVar9 = ABS(pdVar6->r);
        if (dVar8 < dVar9) {
          uVar4 = uVar5;
        }
        uVar4 = uVar4 & 0xffffffff;
        dVar8 = (double)(~-(ulong)(dVar8 < dVar9) & (ulong)dVar8 |
                        (ulong)dVar9 & -(ulong)(dVar8 < dVar9));
        pdVar6 = pdVar6 + 1;
      }
    }
    else {
      pdVar6 = cx + (long)(iVar2 + 1) + -1;
      iVar3 = 1;
      for (iVar7 = 2; iVar7 - uVar1 != 1; iVar7 = iVar7 + 1) {
        dVar9 = ABS(pdVar6->r);
        if (dVar8 < dVar9) {
          iVar3 = iVar7;
        }
        dVar8 = (double)(~-(ulong)(dVar8 < dVar9) & (ulong)dVar8 |
                        (ulong)dVar9 & -(ulong)(dVar8 < dVar9));
        pdVar6 = pdVar6 + iVar2;
      }
    }
  }
  return iVar3;
}

Assistant:

int
izmax1_slu(int *n, doublecomplex *cx, int *incx)
{


    /* System generated locals */
    int ret_val;
    double d__1;
    
    /* Local variables */
    double smax;
    int i, ix;

#define CX(I) cx[(I)-1]

    ret_val = 0;
    if (*n < 1) {
	return ret_val;
    }
    ret_val = 1;
    if (*n == 1) {
	return ret_val;
    }
    if (*incx == 1) {
	goto L30;
    }

/*     CODE FOR INCREMENT NOT EQUAL TO 1 */

    ix = 1;
    smax = (d__1 = CX(1).r, fabs(d__1));
    ix += *incx;
    for (i = 2; i <= *n; ++i) {
	if ((d__1 = CX(ix).r, fabs(d__1)) <= smax) {
	    goto L10;
	}
	ret_val = i;
	smax = (d__1 = CX(ix).r, fabs(d__1));
L10:
	ix += *incx;
/* L20: */
    }
    return ret_val;

/*     CODE FOR INCREMENT EQUAL TO 1 */

L30:
    smax = (d__1 = CX(1).r, fabs(d__1));
    for (i = 2; i <= *n; ++i) {
	if ((d__1 = CX(i).r, fabs(d__1)) <= smax) {
	    goto L40;
	}
	ret_val = i;
	smax = (d__1 = CX(i).r, fabs(d__1));
L40:
	;
    }
    return ret_val;

/*     End of IZMAX1 */

}